

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::IsMember::IsMember<char_const*>(IsMember *this,initializer_list<const_char_*> values)

{
  IsMember *in_RDX;
  allocator_type *in_RSI;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_ffffffffffffffa0;
  allocator<const_char_*> local_49;
  initializer_list<const_char_*> in_stack_ffffffffffffffc8;
  
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x520306);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_RDX,in_stack_ffffffffffffffc8
             ,in_RSI);
  IsMember<std::vector<char_const*,std::allocator<char_const*>>>
            (in_RDX,(vector<const_char_*,_std::allocator<const_char_*>_> *)in_RSI);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(in_stack_ffffffffffffffa0);
  std::allocator<const_char_*>::~allocator(&local_49);
  return;
}

Assistant:

IsMember(std::initializer_list<T> values, Args &&...args)
        : IsMember(std::vector<T>(values), std::forward<Args>(args)...) {}